

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

void __thiscall
flatbuffers::cpp::CppGenerator::GenFieldNames(CppGenerator *this,StructDef *struct_def)

{
  FieldDef *field;
  mapped_type *pmVar1;
  CodeWriter *this_00;
  pointer ppFVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  key_type local_158;
  CppGenerator *local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"  static constexpr std::array<\\","");
  this_00 = &this->code_;
  local_138 = this;
  CodeWriter::operator+=(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"const char *, fields_number> field_names = {\\","");
  CodeWriter::operator+=(this_00,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar4 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"};","");
    CodeWriter::operator+=(this_00,&local_50);
    _Var3._M_p = local_50._M_dataplus._M_p;
  }
  else {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    CodeWriter::operator+=(this_00,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    ppFVar2 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppFVar2 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        field = *ppFVar2;
        if (field->deprecated == false) {
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"FIELD_NAME","");
          Name_abi_cxx11_(&local_130,local_138,field);
          pmVar1 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this_00->value_map_,&local_158);
          std::__cxx11::string::_M_assign((string *)pmVar1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"    \"{{FIELD_NAME}}\"\\","");
          CodeWriter::operator+=(this_00,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if (ppFVar2 + 1 !=
              (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,",","");
            CodeWriter::operator+=(this_00,&local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        ppFVar2 = ppFVar2 + 1;
      } while (ppFVar2 !=
               (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    paVar4 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\n  };","");
    CodeWriter::operator+=(this_00,&local_70);
    _Var3._M_p = local_70._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p,paVar4->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenFieldNames(const StructDef &struct_def) {
    code_ += "  static constexpr std::array<\\";
    code_ += "const char *, fields_number> field_names = {\\";
    if (struct_def.fields.vec.empty()) {
      code_ += "};";
      return;
    }
    code_ += "";
    // Generate the field_names elements.
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) {
        // Deprecated fields won't be accessible.
        continue;
      }
      code_.SetValue("FIELD_NAME", Name(field));
      code_ += R"(    "{{FIELD_NAME}}"\)";
      if (it + 1 != struct_def.fields.vec.end()) { code_ += ","; }
    }
    code_ += "\n  };";
  }